

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_multi_simple_var
              (secp256k1_gej *r,secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,
              void *cbdata,size_t n_points)

{
  int iVar1;
  size_t sVar2;
  secp256k1_scalar scalar;
  secp256k1_ge point;
  secp256k1_gej pointj;
  secp256k1_gej tmpj;
  
  secp256k1_gej_set_infinity(r);
  secp256k1_gej_set_infinity(&tmpj);
  secp256k1_ecmult(r,&tmpj,&secp256k1_scalar_zero,inp_g_sc);
  sVar2 = 0;
  while( true ) {
    if (n_points == sVar2) {
      return 1;
    }
    iVar1 = (*cb)(&scalar,&point,sVar2,cbdata);
    if (iVar1 == 0) break;
    secp256k1_gej_set_ge(&pointj,&point);
    secp256k1_ecmult(&tmpj,&pointj,&scalar,(secp256k1_scalar *)0x0);
    secp256k1_gej_add_var(r,r,&tmpj,(secp256k1_fe *)0x0);
    sVar2 = sVar2 + 1;
  }
  return 0;
}

Assistant:

static int secp256k1_ecmult_multi_simple_var(secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points) {
    size_t point_idx;
    secp256k1_gej tmpj;

    secp256k1_gej_set_infinity(r);
    secp256k1_gej_set_infinity(&tmpj);
    /* r = inp_g_sc*G */
    secp256k1_ecmult(r, &tmpj, &secp256k1_scalar_zero, inp_g_sc);
    for (point_idx = 0; point_idx < n_points; point_idx++) {
        secp256k1_ge point;
        secp256k1_gej pointj;
        secp256k1_scalar scalar;
        if (!cb(&scalar, &point, point_idx, cbdata)) {
            return 0;
        }
        /* r += scalar*point */
        secp256k1_gej_set_ge(&pointj, &point);
        secp256k1_ecmult(&tmpj, &pointj, &scalar, NULL);
        secp256k1_gej_add_var(r, r, &tmpj, NULL);
    }
    return 1;
}